

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall
QStyleSheetStyle::drawPrimitive
          (QStyleSheetStyle *this,PrimitiveElement pe,QStyleOption *opt,QPainter *p,QWidget *w)

{
  QWidgetData *pQVar1;
  Data *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar6 [16];
  QStyleSheetStyle *pQVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  QStyle *pQVar11;
  long lVar12;
  QStyleOption *pQVar13;
  QWidget *obj;
  undefined8 uVar14;
  QStyleOptionTabWidgetFrame *other;
  QAbstractScrollArea *this_01;
  QScrollBar *pQVar15;
  undefined7 extraout_var;
  Node<const_QWidget_*,_QHashDummyValue> *pNVar16;
  undefined8 uVar17;
  QRect *rect;
  QObject *obj_00;
  undefined4 uVar18;
  int iVar19;
  QStyleOptionFrame *other_00;
  long in_FS_OFFSET;
  undefined1 auVar20 [16];
  QRect QVar21;
  QRenderRule rule;
  QStyleOptionTabWidgetFrame frmCopy;
  QStyleOptionFrame frmOpt;
  QWidget *local_210;
  QRect local_1f8;
  QRenderRule local_1e0;
  undefined1 local_158 [8];
  undefined1 *puStack_150;
  QFont local_148 [8];
  undefined8 local_140;
  undefined1 local_130 [16];
  QSharedDataPointer<QStyleSheetBoxData> local_120;
  QSharedDataPointer<QStyleSheetBackgroundData> local_118;
  QSharedDataPointer<QStyleSheetBorderData> local_110;
  QSharedDataPointer<QStyleSheetOutlineData> local_108;
  QSharedDataPointer<QStyleSheetGeometryData> local_100;
  QSharedDataPointer<QStyleSheetPositionData> local_f8;
  QSharedDataPointer<QStyleSheetImageData> local_f0;
  QSharedDataPointer<QStyleSheetImageData> local_e8 [2];
  QPainterPath local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [12];
  Representation RStack_ac;
  undefined1 *local_a8;
  undefined1 auStack_a0 [16];
  QSharedDataPointer<QStyleSheetBoxData> QStack_90;
  QSharedDataPointer<QStyleSheetBackgroundData> local_88;
  QSharedDataPointer<QStyleSheetBorderData> QStack_80;
  long local_38;
  
  pQVar7 = globalStyleSheetStyle;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar11 = baseStyle(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (**(code **)(*(long *)pQVar11 + 0xb0))(pQVar11,pe,opt,p,w,*(code **)(*(long *)pQVar11 + 0xb0))
      ;
      return;
    }
    goto LAB_00366e75;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&local_1e0,0xaa,0x88);
  iVar19 = 0;
  renderRule(&local_1e0,this,&w->super_QObject,opt,0);
  local_1f8.x1.m_i = (opt->rect).x1.m_i;
  local_1f8.y1.m_i = (opt->rect).y1.m_i;
  local_1f8.x2.m_i = (opt->rect).x2.m_i;
  local_1f8.y2.m_i = (opt->rect).y2.m_i;
  local_210 = w;
  if (PE_PanelMenu < pe) goto switchD_00365b10_caseD_5;
  rect = &opt->rect;
  switch(pe) {
  case PE_Frame:
  case PE_FrameDockWidget:
  case PE_FrameWindow:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 5)) {
      opt = (QStyleOption *)0x0;
    }
    if ((QStyleOptionFrame *)opt != (QStyleOptionFrame *)0x0) {
      if ((local_1e0.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_1e0.bd.d.ptr + 0x68))->d
           ).ptr != (QStyleSheetBorderImageData *)0x0 ||
          (*(BorderStyle *)((long)local_1e0.bd.d.ptr + 0x38) != BorderStyle_Native)))) {
        local_c8 = (undefined1  [16])QRenderRule::borderRect(&local_1e0,rect);
        rect = (QRect *)local_c8;
        goto LAB_0036683a;
      }
      local_88.d.ptr = (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_80.d.ptr = (totally_ordered_wrapper<QStyleSheetBorderData_*>)&DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStack_90.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_c8,(QStyleOptionFrame *)opt);
      QRenderRule::configurePalette(&local_1e0,(QPalette *)auStack_a0,Text,Base);
      pQVar11 = baseStyle(this);
      lVar12 = *(long *)pQVar11;
LAB_00365bba:
      (**(code **)(lVar12 + 0xb0))(pQVar11,pe,local_c8,p,w);
LAB_00365bd0:
      QStyleOption::~QStyleOption((QStyleOption *)local_c8);
    }
    goto LAB_00366d57;
  case PE_FrameDefaultButton:
    if ((local_1e0.bd.d.ptr == (QStyleSheetBorderData *)0x0) ||
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_1e0.bd.d.ptr + 0x68))->d).
         ptr == (QStyleSheetBorderImageData *)0x0 &&
        (*(BorderStyle *)((long)local_1e0.bd.d.ptr + 0x38) == BorderStyle_Native)))) {
      bVar8 = QRenderRule::baseStyleCanDraw(&local_1e0);
      if (bVar8) break;
      QWindowsStyle::drawPrimitive((QWindowsStyle *)this,PE_FrameDefaultButton,opt,p,w);
    }
    goto LAB_00366d57;
  case PE_FrameFocusRect:
    if ((local_1e0.ou.d.ptr == (QStyleSheetOutlineData *)0x0) ||
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_1e0.ou.d.ptr + 0x68))->d).
         ptr == (QStyleSheetBorderImageData *)0x0 &&
        (*(BorderStyle *)((long)local_1e0.ou.d.ptr + 0x38) == BorderStyle_Native)))) break;
    QRenderRule::drawOutline(&local_1e0,p,rect);
    goto LAB_00366d57;
  case PE_FrameGroupBox:
    if ((local_1e0.bd.d.ptr == (QStyleSheetBorderData *)0x0) ||
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_1e0.bd.d.ptr + 0x68))->d).
         ptr == (QStyleSheetBorderImageData *)0x0 &&
        (*(BorderStyle *)((long)local_1e0.bd.d.ptr + 0x38) == BorderStyle_Native)))) break;
LAB_0036683a:
    QRenderRule::drawBorder(&local_1e0,p,rect);
    goto LAB_00366d57;
  case PE_FrameMenu:
  case PE_PanelMenuBar:
    bVar8 = QRenderRule::hasDrawable(&local_1e0);
    goto joined_r0x00366b33;
  case PE_FrameStatusBarItem:
    memset(local_c8,0xaa,0x88);
    if (w == (QWidget *)0x0) {
      obj_00 = (QObject *)0x0;
    }
    else {
      obj_00 = *(QObject **)(*(long *)&w->field_0x8 + 0x10);
    }
    renderRule((QRenderRule *)local_c8,this,obj_00,opt,10);
    bVar8 = QRenderRule::hasDrawable((QRenderRule *)local_c8);
    if (bVar8) goto LAB_00366887;
LAB_00366899:
    QRenderRule::~QRenderRule((QRenderRule *)local_c8);
LAB_003668a6:
    iVar19 = 0;
    break;
  case PE_FrameTabWidget:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
       (other = (QStyleOptionTabWidgetFrame *)opt, opt->type != 0xb)) {
      other = (QStyleOptionTabWidgetFrame *)0x0;
    }
    if (other != (QStyleOptionTabWidgetFrame *)0x0) {
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x36);
      if ((QStack_80.d.ptr == (QStyleSheetBorderData *)0x0) ||
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)QStack_80.d.ptr + 0x68))->d).
           ptr == (QStyleSheetBorderImageData *)0x0 &&
          (*(BorderStyle *)((long)QStack_80.d.ptr + 0x38) == BorderStyle_Native)))) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = puStack_150;
        _local_158 = auVar3 << 0x40;
        QRenderRule::drawBackground((QRenderRule *)local_c8,p,rect,(QPoint *)local_158);
        memset((QStyleOptionTabWidgetFrame *)local_158,0xaa,0x88);
        QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame
                  ((QStyleOptionTabWidgetFrame *)local_158,other);
        QRenderRule::configurePalette
                  ((QRenderRule *)local_c8,(QPalette *)local_130,WindowText,Window);
        pQVar11 = baseStyle(this);
        (**(code **)(*(long *)pQVar11 + 0xb0))
                  (pQVar11,8,(QStyleOptionTabWidgetFrame *)local_158,p,w);
        QStyleOption::~QStyleOption((QStyleOption *)local_158);
      }
      else {
LAB_003668d1:
        QRenderRule::drawRule((QRenderRule *)local_c8,p,rect);
      }
      goto LAB_003669a4;
    }
    break;
  case PE_PanelButtonCommand:
  case PE_PanelButtonTool:
    lVar12 = QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
    if ((((lVar12 == 0) || (local_1e0.bg.d.ptr == (QStyleSheetBackgroundData *)0x0)) ||
        ((cVar9 = QPixmap::isNull(), cVar9 != '\0' &&
         (*(int *)(*(long *)((long)local_1e0.bg.d.ptr + 8) + 4) == 0)))) ||
       ((local_1e0.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_1e0.bd.d.ptr + 0x68))->d)
          .ptr != (QStyleSheetBorderImageData *)0x0 ||
         (*(BorderStyle *)((long)local_1e0.bd.d.ptr + 0x38) != BorderStyle_Native)))))) {
      if ((local_1e0.bd.d.ptr == (QStyleSheetBorderData *)0x0) ||
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_1e0.bd.d.ptr + 0x68))->d
           ).ptr == (QStyleSheetBorderImageData *)0x0 &&
          (*(BorderStyle *)((long)local_1e0.bd.d.ptr + 0x38) == BorderStyle_Native)))) break;
      local_c8 = (undefined1  [16])QRenderRule::boxRect(&local_1e0,rect,1);
      rect = (QRect *)local_c8;
    }
    else {
      QWindowsStyle::drawPrimitive((QWindowsStyle *)this,pe,opt,p,w);
      cVar9 = QPixmap::isNull();
      if ((cVar9 != '\0') && (local_1e0.img.d.ptr == (QStyleSheetImageData *)0x0))
      goto LAB_00366d57;
      QVar21 = QRenderRule::boxRect(&local_1e0,rect,1);
      auVar20._12_4_ = QVar21.y2.m_i;
      auVar20._0_4_ = (undefined4)(QVar21._0_8_ + 1);
      auVar20._8_4_ = (undefined4)(QVar21._8_8_ + 0xffffffff);
      auVar20._4_4_ = auVar20._8_4_;
      rect = (QRect *)local_c8;
      local_c8._8_8_ = auVar20._8_8_ + -0x100000000;
      local_c8._0_8_ = CONCAT44(QVar21.y1.m_i.m_i,auVar20._0_4_) + 0x100000000;
    }
    goto LAB_0036659b;
  case PE_PanelLineEdit:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
       (other_00 = (QStyleOptionFrame *)opt, opt->type != 5)) {
      other_00 = (QStyleOptionFrame *)0x0;
    }
    if (other_00 != (QStyleOptionFrame *)0x0) {
      if ((w != (QWidget *)0x0) && (obj = containerWidget(w), obj != w)) {
        memset((QRenderRule *)local_c8,0xaa,0x88);
        renderRule((QRenderRule *)local_c8,this,&obj->super_QObject,opt,0);
        if (((QStack_80.d.ptr != (QStyleSheetBorderData *)0x0) &&
            (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)QStack_80.d.ptr + 0x68))->d
              ).ptr != (QStyleSheetBorderImageData *)0x0 ||
             (*(BorderStyle *)((long)QStack_80.d.ptr + 0x38) != BorderStyle_Native)))) ||
           (bVar8 = QRenderRule::baseStyleCanDraw((QRenderRule *)local_c8), !bVar8))
        goto LAB_003669a4;
        QRenderRule::operator=(&local_1e0,(QRenderRule *)local_c8);
        QRenderRule::~QRenderRule((QRenderRule *)local_c8);
      }
      if ((local_1e0.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_1e0.bd.d.ptr + 0x68))->d
           ).ptr != (QStyleSheetBorderImageData *)0x0 ||
          (*(BorderStyle *)((long)local_1e0.bd.d.ptr + 0x38) != BorderStyle_Native))))
      goto LAB_0036659b;
      local_88.d.ptr = (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_80.d.ptr = (totally_ordered_wrapper<QStyleSheetBorderData_*>)&DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStack_90.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_c8,other_00);
      QRenderRule::configurePalette(&local_1e0,(QPalette *)auStack_a0,Text,Base);
      if (local_1e0.b.d.ptr == (QStyleSheetBoxData *)0x0) {
      }
      else {
        uVar14._0_4_ = local_b8._0_4_ + *(int *)((long)local_1e0.b.d.ptr + 0x10);
        uVar17._0_4_ = local_b8._8_4_ - *(int *)((long)local_1e0.b.d.ptr + 8);
        uVar14._4_4_ = local_b8._4_4_ + *(int *)((long)local_1e0.b.d.ptr + 4);
        uVar17._4_4_ = RStack_ac.m_i - *(int *)((long)local_1e0.b.d.ptr + 0xc);
        local_b8._0_8_ = uVar14;
        unique0x100017cc = uVar17;
      }
      local_b8._8_4_ = (int)register0x00000008;
      RStack_ac.m_i = SUB84(register0x00000008,4);
      local_b8._0_4_ = (int)local_b8._0_8_;
      local_b8._4_4_ = SUB84(local_b8._0_8_,4);
      bVar8 = QRenderRule::baseStyleCanDraw(&local_1e0);
      if (bVar8) {
        QRenderRule::drawBackgroundImage(&local_1e0,p,rect,(QPoint)0x0);
        uVar18 = 0x12;
      }
      else {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = puStack_150;
        _local_158 = auVar6 << 0x40;
        QRenderRule::drawBackground(&local_1e0,p,rect,(QPoint *)local_158);
        uVar18 = 5;
        if ((int)local_88.d.ptr < 1) goto LAB_00365bd0;
      }
      pQVar11 = baseStyle(this);
      (**(code **)(*(long *)pQVar11 + 0xb0))(pQVar11,uVar18,local_c8,p,w);
      goto LAB_00365bd0;
    }
    goto LAB_00366d57;
  case PE_IndicatorArrowDown:
    iVar19 = 1;
    break;
  case PE_IndicatorArrowLeft:
    iVar19 = 3;
    break;
  case PE_IndicatorArrowRight:
switchD_00365b10_caseD_15:
    iVar19 = 4;
    break;
  case PE_IndicatorArrowUp:
    iVar19 = 2;
    break;
  case PE_IndicatorBranch:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar13 = opt, opt->type != 10)) {
      pQVar13 = (QStyleOption *)0x0;
    }
    if (pQVar13 != (QStyleOption *)0x0) {
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x29);
      bVar8 = QRenderRule::hasDrawable((QRenderRule *)local_c8);
      if (bVar8) {
        pQVar11 = QStyle::proxy((QStyle *)CONCAT71(extraout_var,bVar8));
        (**(code **)(*(long *)pQVar11 + 0xb0))(pQVar11,0x2d,pQVar13,p,w);
        goto LAB_003668d1;
      }
      pQVar11 = baseStyle(this);
      (**(code **)(*(long *)pQVar11 + 0xb0))(pQVar11,0x17,pQVar13,p,w);
      goto LAB_003669a4;
    }
    goto LAB_00366d57;
  case PE_IndicatorButtonDropDown:
    memset((QRenderRule *)local_c8,0xaa,0x88);
    renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x11);
    if ((QStack_80.d.ptr == (QStyleSheetBorderData *)0x0) ||
       (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)QStack_80.d.ptr + 0x68))->d).ptr
         == (QStyleSheetBorderImageData *)0x0 &&
        (*(BorderStyle *)((long)QStack_80.d.ptr + 0x38) == BorderStyle_Native)))) goto LAB_00366899;
    QRenderRule::drawBorder(&local_1e0,p,rect);
    goto LAB_003669a4;
  case PE_IndicatorItemViewItemCheck:
    iVar19 = 0x4d;
    break;
  case PE_IndicatorCheckBox:
    iVar19 = 5;
    break;
  case PE_IndicatorDockWidgetResizeHandle:
    iVar19 = 0x3d;
    break;
  case PE_IndicatorHeaderArrow:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar13 = opt, opt->type != 8)) {
      pQVar13 = (QStyleOption *)0x0;
    }
    if (pQVar13 != (QStyleOption *)0x0) {
      iVar19 = (*(int *)((long)&pQVar13[1].styleObject + 4) != 1) + 0x2b;
    }
    break;
  case PE_IndicatorMenuCheckMark:
    iVar19 = 0x25;
    break;
  case PE_IndicatorProgressChunk:
    iVar19 = 0x2d;
    break;
  case PE_IndicatorRadioButton:
    iVar19 = 6;
    break;
  case PE_IndicatorSpinDown:
  case PE_IndicatorSpinMinus:
    iVar19 = 0xe;
    break;
  case PE_IndicatorSpinPlus:
  case PE_IndicatorSpinUp:
    iVar19 = 0xc;
    break;
  case PE_IndicatorToolBarHandle:
  case PE_IndicatorToolBarSeparator:
    memset((QRenderRule *)local_c8,0xaa,0x88);
    renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,
               (pe != PE_IndicatorToolBarHandle) + 0x21);
    bVar8 = QRenderRule::hasDrawable((QRenderRule *)local_c8);
    if (!bVar8) goto LAB_00366899;
LAB_00366887:
    QRenderRule::drawRule((QRenderRule *)local_c8,p,rect);
LAB_003669a4:
    QRenderRule::~QRenderRule((QRenderRule *)local_c8);
    goto LAB_00366d57;
  case PE_PanelTipLabel:
    bVar8 = QRenderRule::hasDrawable(&local_1e0);
    if (!bVar8) break;
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 5)) {
      opt = (QStyleOption *)0x0;
    }
    if ((QStyleOptionFrame *)opt != (QStyleOptionFrame *)0x0) {
      if ((local_1e0.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_1e0.bd.d.ptr + 0x68))->d
           ).ptr != (QStyleSheetBorderImageData *)0x0 ||
          (*(BorderStyle *)((long)local_1e0.bd.d.ptr + 0x38) != BorderStyle_Native))))
      goto LAB_0036659b;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_c8._8_8_;
      local_c8 = auVar4 << 0x40;
      QRenderRule::drawBackground(&local_1e0,p,rect,(QPoint *)local_c8);
      local_88.d.ptr = (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QStack_80.d.ptr = (totally_ordered_wrapper<QStyleSheetBorderData_*>)&DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStack_90.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      auStack_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_c8,(QStyleOptionFrame *)opt);
      _local_b8 = QRenderRule::borderRect(&local_1e0,rect);
      QBrush::QBrush((QBrush *)local_158,NoBrush);
      QPalette::setBrush((ColorGroup)auStack_a0,Mid,(QBrush *)&DAT_0000000a);
      QBrush::~QBrush((QBrush *)local_158);
      pQVar11 = baseStyle(this);
      lVar12 = *(long *)pQVar11;
      pe = PE_PanelTipLabel;
      goto LAB_00365bba;
    }
    goto LAB_00366d57;
  case PE_IndicatorTabTear:
    iVar19 = 0x30;
    break;
  case PE_PanelScrollAreaCorner:
    iVar19 = 0x4e;
    break;
  case PE_Widget:
    if (w != (QWidget *)0x0) {
      bVar8 = QRenderRule::hasDrawable(&local_1e0);
      if (!bVar8) {
        local_158 = (undefined1  [8])containerWidget(w);
        this_00 = (styleSheetCaches->autoFillDisabledWidgets).q_hash.d;
        if ((this_00 == (Data *)0x0) ||
           (pNVar16 = QHashPrivate::Data<QHashPrivate::Node<QWidget_const*,QHashDummyValue>>::
                      findNode<QWidget_const*>
                                ((Data<QHashPrivate::Node<QWidget_const*,QHashDummyValue>> *)this_00
                                 ,(QWidget **)local_158),
           pNVar16 == (Node<const_QWidget_*,_QHashDummyValue> *)0x0)) {
          bVar8 = false;
LAB_003669d4:
          bVar5 = bVar8;
          bVar8 = false;
        }
        else if (local_158 == (undefined1  [8])w) {
          bVar8 = true;
          bVar5 = false;
        }
        else {
          renderRule((QRenderRule *)local_c8,this,(QObject *)local_158,opt,0);
          bVar5 = true;
          if (local_88.d.ptr == (QStyleSheetBackgroundData *)0x0) {
            bVar8 = true;
          }
          else {
            cVar9 = QPixmap::isNull();
            bVar8 = true;
            if (cVar9 == '\0') goto LAB_003669d4;
            bVar8 = *(int *)(*(long *)((long)local_88.d.ptr + 8) + 4) == 0;
          }
        }
        if (bVar5) {
          QRenderRule::~QRenderRule((QRenderRule *)local_c8);
        }
        if (bVar8) {
          QWidget::backgroundRole(w);
          QPalette::brush((int)opt + 0x28,Dark);
          QPainter::fillRect((QRect *)p,(QBrush *)rect);
        }
        goto LAB_003668a6;
      }
    }
    this_01 = (QAbstractScrollArea *)
              QMetaObject::cast((QObject *)&QAbstractScrollArea::staticMetaObject);
    if (this_01 != (QAbstractScrollArea *)0x0) {
      local_c8._0_8_ = (**(code **)(**(long **)(this_01 + 8) + 0xb8))();
      QRenderRule::drawBackground(&local_1e0,p,rect,(QPoint *)local_c8);
      if (local_1e0.bd.d.ptr != (QStyleSheetBorderData *)0x0) {
        local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_c8 = (undefined1  [16])QRenderRule::borderRect(&local_1e0,rect);
        iVar10 = 0;
        iVar19 = (**(code **)(*(long *)this + 0xf0))(this,0x11,opt,w,0);
        if (iVar19 != 0) {
          puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
          local_158 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          pQVar15 = QAbstractScrollArea::verticalScrollBar(this_01);
          if ((((pQVar15->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) !=
              0) {
            pQVar15 = QAbstractScrollArea::verticalScrollBar(this_01);
            pQVar1 = (pQVar15->super_QAbstractSlider).super_QWidget.data;
            iVar10 = ~(pQVar1->crect).x2.m_i + (pQVar1->crect).x1.m_i;
          }
          pQVar15 = QAbstractScrollArea::horizontalScrollBar(this_01);
          iVar19 = 0;
          if ((((pQVar15->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) !=
              0) {
            pQVar15 = QAbstractScrollArea::horizontalScrollBar(this_01);
            pQVar1 = (pQVar15->super_QAbstractSlider).super_QWidget.data;
            iVar19 = ~(pQVar1->crect).y2.m_i + (pQVar1->crect).y1.m_i;
          }
          puStack_150._4_4_ = iVar19 + local_c8._12_4_;
          puStack_150._0_4_ = iVar10 + local_c8._8_4_;
          local_158 = (undefined1  [8])local_c8._0_8_;
          local_c8 = (undefined1  [16])
                     QStyle::visualRect(opt->direction,(QRect *)local_c8,(QRect *)local_158);
        }
        QRenderRule::drawBorder(&local_1e0,p,(QRect *)local_c8);
      }
      iVar19 = 0;
      if (this_01 != (QAbstractScrollArea *)0x0) break;
    }
  case PE_PanelStatusBar:
  case PE_PanelMenu:
    iVar19 = 0;
    bVar8 = QRenderRule::hasDrawable(&local_1e0);
    if (!bVar8) break;
LAB_0036659b:
    QRenderRule::drawRule(&local_1e0,p,rect);
    goto LAB_00366d57;
  case PE_IndicatorColumnViewArrow:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar13 = opt, opt->type != 10)) {
      pQVar13 = (QStyleOption *)0x0;
    }
    if (pQVar13 == (QStyleOption *)0x0) goto switchD_00365b10_caseD_15;
    iVar19 = (pQVar13->direction != RightToLeft) + 3;
    break;
  case PE_PanelItemViewItem:
    iVar19 = 0x4a;
    break;
  case PE_PanelItemViewRow:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar13 = opt, opt->type != 10)) {
      pQVar13 = (QStyleOption *)0x0;
    }
    iVar19 = 0;
    if (pQVar13 == (QStyleOption *)0x0) {
      bVar8 = false;
    }
    else if (pQVar13[3].version == 0) {
      bVar8 = false;
    }
    else {
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x4a);
      iVar19 = 0;
      if ((local_88.d.ptr == (QStyleSheetBackgroundData *)0x0) ||
         ((cVar9 = QPixmap::isNull(), cVar9 != '\0' &&
          (*(int *)(*(long *)((long)local_88.d.ptr + 8) + 4) == 0)))) {
        bVar8 = false;
      }
      else {
        iVar10 = QColor::alpha();
        if (iVar10 != 1) {
          pQVar11 = baseStyle(this);
          (**(code **)(*(long *)pQVar11 + 0xb0))(pQVar11,0x2d,opt,p,w);
        }
        if (((((ulong)pQVar13[1].palette.d & 0x4000000000) == 0) ||
            ((pQVar13[3].version != 4 && (pQVar13[3].version != 1)))) ||
           (QStack_80.d.ptr == (QStyleSheetBorderData *)0x0)) {
          bVar8 = false;
          iVar19 = 0x4a;
        }
        else {
          bVar8 = QRenderRule::hasDrawable((QRenderRule *)local_c8);
          if (bVar8) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = puStack_150;
            _local_158 = auVar2 << 0x40;
            QRenderRule::drawBackground((QRenderRule *)local_c8,p,&local_1f8,(QPoint *)local_158);
            _local_158 = (undefined1  [16])
                         QRenderRule::contentsRect((QRenderRule *)local_c8,&local_1f8);
            QRenderRule::drawImage((QRenderRule *)local_c8,p,(QRect *)local_158);
          }
          else {
            pQVar11 = baseStyle(this);
            (**(code **)(*(long *)pQVar11 + 0xb0))(pQVar11,0x2d,opt,p,w);
          }
          bVar8 = true;
        }
      }
      QRenderRule::~QRenderRule((QRenderRule *)local_c8);
    }
joined_r0x00366b33:
    if (!bVar8) break;
    goto LAB_00366d57;
  case PE_IndicatorTabClose:
    if (w == (QWidget *)0x0) {
      local_210 = (QWidget *)0x0;
    }
    else {
      pQVar11 = baseStyle(this);
      local_158 = (undefined1  [8])w;
      ::QVariant::fromValue<void_*,_true>
                ((enable_if_t<std::conjunction_v<std::is_copy_constructible<void_*>,_std::is_destructible<void_*>_>,_QVariant>
                  *)local_c8,(void **)local_158);
      QObject::doSetProperty
                ((char *)pQVar11,(QVariant *)"_q_styleSheetRealCloseButton",
                 (enable_if_t<std::conjunction_v<std::is_copy_constructible<void_*>,_std::is_destructible<void_*>_>,_QVariant>
                  *)local_c8);
      ::QVariant::~QVariant
                ((enable_if_t<std::conjunction_v<std::is_copy_constructible<void_*>,_std::is_destructible<void_*>_>,_QVariant>
                  *)local_c8);
      local_210 = *(QWidget **)(*(long *)&w->field_0x8 + 0x10);
    }
    iVar19 = 0x4f;
  }
switchD_00365b10_caseD_5:
  if (iVar19 == 0) {
    pQVar11 = baseStyle(this);
    (**(code **)(*(long *)pQVar11 + 0xb0))(pQVar11,pe,opt,p,local_210);
  }
  else {
    memset((QRenderRule *)local_158,0xaa,0x88);
    renderRule((QRenderRule *)local_158,this,&local_210->super_QObject,opt,iVar19);
    bVar8 = QRenderRule::hasDrawable((QRenderRule *)local_158);
    if (bVar8) {
      QRenderRule::drawRule((QRenderRule *)local_158,p,&local_1f8);
    }
    else {
      pQVar11 = baseStyle(this);
      (**(code **)(*(long *)pQVar11 + 0xb0))(pQVar11,pe,opt,p,local_210);
    }
    QPainterPath::~QPainterPath(local_d8);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(local_e8);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_f0);
    if (local_f8.d.ptr != (QStyleSheetPositionData *)0x0) {
      LOCK();
      *(int *)local_f8.d.ptr = *(int *)local_f8.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_f8.d.ptr == 0) && (local_f8.d.ptr != (QStyleSheetPositionData *)0x0)) {
        operator_delete((void *)local_f8.d.ptr,0x24);
      }
    }
    if (local_100.d.ptr != (QStyleSheetGeometryData *)0x0) {
      LOCK();
      *(int *)local_100.d.ptr = *(int *)local_100.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_100.d.ptr == 0) && (local_100.d.ptr != (QStyleSheetGeometryData *)0x0)) {
        operator_delete((void *)local_100.d.ptr,0x1c);
      }
    }
    QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_108);
    QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_110);
    QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_118);
    if (local_120.d.ptr != (QStyleSheetBoxData *)0x0) {
      LOCK();
      *(int *)local_120.d.ptr = *(int *)local_120.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_120.d.ptr == 0) && (local_120.d.ptr != (QStyleSheetBoxData *)0x0)) {
        operator_delete((void *)local_120.d.ptr,0x28);
      }
    }
    QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer
              ((QSharedDataPointer<QStyleSheetPaletteData> *)(local_130 + 8));
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)local_130);
    QFont::~QFont(local_148);
    QBrush::~QBrush((QBrush *)(local_158 + 8));
  }
  baseStyle(this);
  QObject::property((char *)local_158);
  cVar9 = ::QVariant::toBool();
  ::QVariant::~QVariant((QVariant *)local_158);
  if (cVar9 != '\0') {
    pQVar11 = baseStyle(this);
    local_158._0_4_ = 0;
    local_158._4_4_ = 0;
    puStack_150._0_4_ = 0;
    puStack_150._4_4_ = 0;
    local_148 = (QFont  [8])0x0;
    local_140._0_4_ = 2;
    local_140._4_4_ = 0;
    QObject::doSetProperty
              ((char *)pQVar11,(QVariant *)"_q_styleSheetRealCloseButton",(QVariant *)local_158);
    ::QVariant::~QVariant((QVariant *)local_158);
  }
LAB_00366d57:
  QPainterPath::~QPainterPath(&local_1e0.clipPath);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_1e0.iconPtr);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_1e0.img);
  if (local_1e0.p.d.ptr != (QStyleSheetPositionData *)0x0) {
    LOCK();
    *(int *)local_1e0.p.d.ptr = *(int *)local_1e0.p.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_1e0.p.d.ptr == 0) && (local_1e0.p.d.ptr != (QStyleSheetPositionData *)0x0)) {
      operator_delete((void *)local_1e0.p.d.ptr,0x24);
    }
  }
  if (local_1e0.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
    LOCK();
    *(int *)local_1e0.geo.d.ptr = *(int *)local_1e0.geo.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_1e0.geo.d.ptr == 0) &&
       (local_1e0.geo.d.ptr != (QStyleSheetGeometryData *)0x0)) {
      operator_delete((void *)local_1e0.geo.d.ptr,0x1c);
    }
  }
  QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_1e0.ou);
  QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_1e0.bd);
  QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_1e0.bg);
  if (local_1e0.b.d.ptr != (QStyleSheetBoxData *)0x0) {
    LOCK();
    *(int *)local_1e0.b.d.ptr = *(int *)local_1e0.b.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_1e0.b.d.ptr == 0) && (local_1e0.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
      operator_delete((void *)local_1e0.b.d.ptr,0x28);
    }
  }
  QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_1e0.pal);
  QHash<QString,_QVariant>::~QHash(&local_1e0.styleHints);
  QFont::~QFont(&local_1e0.font);
  QBrush::~QBrush(&local_1e0.defaultBackground);
  if (pQVar7 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00366e75:
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::drawPrimitive(PrimitiveElement pe, const QStyleOption *opt, QPainter *p,
                                     const QWidget *w) const
{
    RECURSION_GUARD(baseStyle()->drawPrimitive(pe, opt, p, w); return)

    int pseudoElement = PseudoElement_None;
    QRenderRule rule = renderRule(w, opt);
    QRect rect = opt->rect;

    switch (pe) {

    case PE_FrameStatusBarItem: {
        QRenderRule subRule = renderRule(w ? w->parentWidget() : nullptr, opt, PseudoElement_Item);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, opt->rect);
            return;
        }
        break;
                            }

    case PE_IndicatorArrowDown:
        pseudoElement = PseudoElement_DownArrow;
        break;

    case PE_IndicatorArrowUp:
        pseudoElement = PseudoElement_UpArrow;
        break;

    case PE_IndicatorRadioButton:
        pseudoElement = PseudoElement_ExclusiveIndicator;
        break;

    case PE_IndicatorItemViewItemCheck:
        pseudoElement = PseudoElement_ViewItemIndicator;
        break;

    case PE_IndicatorCheckBox:
        pseudoElement = PseudoElement_Indicator;
        break;

    case PE_IndicatorHeaderArrow:
        if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
            pseudoElement = hdr->sortIndicator == QStyleOptionHeader::SortUp
                ? PseudoElement_HeaderViewUpArrow
                : PseudoElement_HeaderViewDownArrow;
        }
        break;

    case PE_PanelButtonTool:
    case PE_PanelButtonCommand:
#if QT_CONFIG(abstractbutton)
        if (qobject_cast<const QAbstractButton *>(w) && rule.hasBackground() && rule.hasNativeBorder()) {
            //the window style will draw the borders
            ParentStyle::drawPrimitive(pe, opt, p, w);
            if (!rule.background()->pixmap.isNull() || rule.hasImage()) {
                rule.drawRule(p, rule.boxRect(opt->rect, QRenderRule::Margin).adjusted(1,1,-1,-1));
            }
            return;
        }
#endif
        if (!rule.hasNativeBorder()) {
            rule.drawRule(p, rule.boxRect(opt->rect, QRenderRule::Margin));
            return;
        }
        break;

    case PE_IndicatorButtonDropDown: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_ToolButtonMenu);
        if (!subRule.hasNativeBorder()) {
            rule.drawBorder(p, opt->rect);
            return;
        }
        break;
                                     }

    case PE_FrameDefaultButton:
        if (rule.hasNativeBorder()) {
            if (rule.baseStyleCanDraw())
                break;
            QWindowsStyle::drawPrimitive(pe, opt, p, w);
        }
        return;

    case PE_FrameWindow:
    case PE_FrameDockWidget:
    case PE_Frame:
        if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (rule.hasNativeBorder()) {
                QStyleOptionFrame frmOpt(*frm);
                rule.configurePalette(&frmOpt.palette, QPalette::Text, QPalette::Base);
                baseStyle()->drawPrimitive(pe, &frmOpt, p, w);
            } else {
                rule.drawBorder(p, rule.borderRect(opt->rect));
            }
        }
        return;

    case PE_PanelLineEdit:
        if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            // Fall back to container widget's render rule
            if (w) {
                if (QWidget *container = containerWidget(w); container != w) {
                    QRenderRule containerRule = renderRule(container, opt);
                    if (!containerRule.hasNativeBorder() || !containerRule.baseStyleCanDraw())
                        return;
                    rule = containerRule;
                }
            }

            if (rule.hasNativeBorder()) {
                QStyleOptionFrame frmOpt(*frm);
                rule.configurePalette(&frmOpt.palette, QPalette::Text, QPalette::Base);
                frmOpt.rect = rule.borderRect(frmOpt.rect);
                if (rule.baseStyleCanDraw()) {
                    rule.drawBackgroundImage(p, opt->rect);
                    baseStyle()->drawPrimitive(pe, &frmOpt, p, w);
                } else {
                    rule.drawBackground(p, opt->rect);
                    if (frmOpt.lineWidth > 0)
                        baseStyle()->drawPrimitive(PE_FrameLineEdit, &frmOpt, p, w);
                }
            } else {
                rule.drawRule(p, opt->rect);
            }
        }
        return;

    case PE_Widget:
        if (w && !rule.hasDrawable()) {
            QWidget *container = containerWidget(w);
            if (styleSheetCaches->autoFillDisabledWidgets.contains(container)
                && (container == w || !renderRule(container, opt).hasBackground())) {
                //we do not have a background, but we disabled the autofillbackground anyway. so fill the background now.
                // (this may happen if we have rules like :focus)
                p->fillRect(opt->rect, opt->palette.brush(w->backgroundRole()));
            }
            break;
        }
#if QT_CONFIG(scrollarea)
        if (const QAbstractScrollArea *sa = qobject_cast<const QAbstractScrollArea *>(w)) {
            const QAbstractScrollAreaPrivate *sap = sa->d_func();
            rule.drawBackground(p, opt->rect, sap->contentsOffset());
            if (rule.hasBorder()) {
                QRect brect = rule.borderRect(opt->rect);
                if (styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, opt, w)) {
                    QRect r = brect.adjusted(0, 0, sa->verticalScrollBar()->isVisible() ? -sa->verticalScrollBar()->width() : 0,
                                             sa->horizontalScrollBar()->isVisible() ? -sa->horizontalScrollBar()->height() : 0);
                    brect = QStyle::visualRect(opt->direction, brect, r);
                }
                rule.drawBorder(p, brect);
            }
            break;
        }
#endif
        Q_FALLTHROUGH();
    case PE_PanelMenu:
    case PE_PanelStatusBar:
        if (rule.hasDrawable()) {
            rule.drawRule(p, opt->rect);
            return;
        }
    break;

    case PE_FrameMenu:
        if (rule.hasDrawable()) {
            // Drawn by PE_PanelMenu
            return;
        }
        break;

    case PE_PanelMenuBar:
    if (rule.hasDrawable()) {
        // Drawn by PE_Widget
        return;
    }
    break;

    case PE_IndicatorToolBarSeparator:
    case PE_IndicatorToolBarHandle: {
        PseudoElement ps = pe == PE_IndicatorToolBarHandle ? PseudoElement_ToolBarHandle : PseudoElement_ToolBarSeparator;
        QRenderRule subRule = renderRule(w, opt, ps);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, opt->rect);
            return;
        }
                                    }
        break;

    case PE_IndicatorMenuCheckMark:
        pseudoElement = PseudoElement_MenuCheckMark;
        break;

    case PE_IndicatorArrowLeft:
        pseudoElement = PseudoElement_LeftArrow;
        break;

    case PE_IndicatorArrowRight:
        pseudoElement = PseudoElement_RightArrow;
        break;

    case PE_IndicatorColumnViewArrow:
#if QT_CONFIG(itemviews)
        if (const QStyleOptionViewItem *viewOpt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            bool reverse = (viewOpt->direction == Qt::RightToLeft);
            pseudoElement = reverse ? PseudoElement_LeftArrow : PseudoElement_RightArrow;
        } else
#endif
        {
            pseudoElement = PseudoElement_RightArrow;
        }
        break;

#if QT_CONFIG(itemviews)
    case PE_IndicatorBranch:
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TreeViewBranch);
            if (subRule.hasDrawable()) {
                proxy()->drawPrimitive(PE_PanelItemViewRow, vopt, p, w);
                subRule.drawRule(p, opt->rect);
            } else {
                baseStyle()->drawPrimitive(pe, vopt, p, w);
            }
        }
        return;
#endif // QT_CONFIG(itemviews)

    case PE_PanelTipLabel:
        if (!rule.hasDrawable())
            break;

        if (const QStyleOptionFrame *frmOpt = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (rule.hasNativeBorder()) {
                rule.drawBackground(p, opt->rect);
                QStyleOptionFrame optCopy(*frmOpt);
                optCopy.rect = rule.borderRect(opt->rect);
                optCopy.palette.setBrush(QPalette::Window, Qt::NoBrush); // oh dear
                baseStyle()->drawPrimitive(pe, &optCopy, p, w);
            } else {
                rule.drawRule(p, opt->rect);
            }
        }
        return;

    case PE_FrameGroupBox:
        if (rule.hasNativeBorder())
            break;
        rule.drawBorder(p, opt->rect);
        return;

#if QT_CONFIG(tabwidget)
    case PE_FrameTabWidget:
        if (const QStyleOptionTabWidgetFrame *frm = qstyleoption_cast<const QStyleOptionTabWidgetFrame *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TabWidgetPane);
            if (subRule.hasNativeBorder()) {
                subRule.drawBackground(p, opt->rect);
                QStyleOptionTabWidgetFrame frmCopy(*frm);
                subRule.configurePalette(&frmCopy.palette, QPalette::WindowText, QPalette::Window);
                baseStyle()->drawPrimitive(pe, &frmCopy, p, w);
            } else {
                subRule.drawRule(p, opt->rect);
            }
            return;
        }
        break;
#endif // QT_CONFIG(tabwidget)

    case PE_IndicatorProgressChunk:
        pseudoElement = PseudoElement_ProgressBarChunk;
        break;

    case PE_IndicatorTabTear:
        pseudoElement = PseudoElement_TabBarTear;
        break;

    case PE_FrameFocusRect:
        if (!rule.hasNativeOutline()) {
            rule.drawOutline(p, opt->rect);
            return;
        }
        break;

    case PE_IndicatorDockWidgetResizeHandle:
        pseudoElement = PseudoElement_DockWidgetSeparator;
        break;

    case PE_PanelItemViewRow:
        // For compatibility reasons, QTreeView draws different parts of
        // the background of an item row separately, before calling the
        // delegate to draw the item. The row background of an item is
        // however not separately styleable through a style sheet, but
        // only indirectly through the background of the item. To get the
        // same background for all parts drawn by QTreeView, we have to
        // use the background rule for the item here.
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            // default handling for drawing empty space
            if (vopt->viewItemPosition == QStyleOptionViewItem::Invalid)
                break;
            if (QRenderRule rule = renderRule(w, opt, PseudoElement_ViewItem); rule.hasBackground()) {
                // if the item background is not fully opaque, then we have to paint the row
                if (rule.background()->brush.color().alpha() != 1.0)
                    baseStyle()->drawPrimitive(pe, opt, p, w);
                // Skip border for the branch and draw only the brackground
                if (vopt->features & QStyleOptionViewItem::IsDecorationForRootColumn &&
                    (vopt->viewItemPosition == QStyleOptionViewItem::Beginning ||
                     vopt->viewItemPosition == QStyleOptionViewItem::OnlyOne) && rule.hasBorder()) {
                    if (rule.hasDrawable()) {
                        rule.drawBackground(p, rect);
                        rule.drawImage(p, rule.contentsRect(rect));
                    } else {
                        baseStyle()->drawPrimitive(pe, opt, p, w);
                    }
                    return;
                }
                pseudoElement = PseudoElement_ViewItem;
            }
        }
        break;
    case PE_PanelItemViewItem:
        pseudoElement = PseudoElement_ViewItem;
        break;

    case PE_PanelScrollAreaCorner:
        pseudoElement = PseudoElement_ScrollAreaCorner;
        break;

    case PE_IndicatorSpinDown:
    case PE_IndicatorSpinMinus:
        pseudoElement = PseudoElement_SpinBoxDownArrow;
        break;

    case PE_IndicatorSpinUp:
    case PE_IndicatorSpinPlus:
        pseudoElement = PseudoElement_SpinBoxUpArrow;
        break;
#if QT_CONFIG(tabbar)
    case PE_IndicatorTabClose:
        if (w) {
            // QMacStyle needs a real widget, not its parent - to implement
            // 'document mode' properly, drawing nothing if a tab is not hovered.
            baseStyle()->setProperty("_q_styleSheetRealCloseButton", QVariant::fromValue((void *)w));
            w = w->parentWidget(); //match on the QTabBar instead of the CloseButton
        }
        pseudoElement = PseudoElement_TabBarTabCloseButton;
        break;
#endif

    default:
        break;
    }

    if (pseudoElement != PseudoElement_None) {
        QRenderRule subRule = renderRule(w, opt, pseudoElement);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, rect);
        } else {
            baseStyle()->drawPrimitive(pe, opt, p, w);
        }
    } else {
        baseStyle()->drawPrimitive(pe, opt, p, w);
    }

    if (baseStyle()->property("_q_styleSheetRealCloseButton").toBool())
        baseStyle()->setProperty("_q_styleSheetRealCloseButton", QVariant());
}